

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O3

void __thiscall
iqxmlrpc::http::Response_header::Response_header
          (Response_header *this,Verification_level lev,string *to_parse)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  Malformed_packet *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ulong uVar5;
  long lVar6;
  Token resp_line;
  string local_c8;
  int local_a4;
  string *local_a0;
  undefined1 local_98 [32];
  _Elt_pointer local_78;
  _Map_pointer ppbStack_70;
  _Elt_pointer local_68;
  _Elt_pointer pbStack_60;
  _Elt_pointer local_58;
  _Map_pointer ppbStack_50;
  is_classifiedF local_40;
  
  Header::Header(&this->super_Header,lev);
  (this->super_Header)._vptr_Header = (_func_int **)&PTR__Response_header_00188c88;
  local_a0 = (string *)&this->phrase_;
  (this->phrase_)._M_dataplus._M_p = (pointer)&(this->phrase_).field_2;
  (this->phrase_)._M_string_length = 0;
  (this->phrase_).field_2._M_local_buf[0] = '\0';
  Header::parse(&this->super_Header,to_parse);
  local_98._0_8_ = local_98 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"server","");
  paVar2 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"unknown","");
  Header::set_option_default(&this->super_Header,(string *)local_98,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  local_58 = (_Elt_pointer)0x0;
  ppbStack_50 = (_Map_pointer)0x0;
  local_68 = (_Elt_pointer)0x0;
  pbStack_60 = (_Elt_pointer)0x0;
  local_78 = (_Elt_pointer)0x0;
  ppbStack_70 = (_Map_pointer)0x0;
  local_98._16_8_ = 0;
  local_98._24_8_ = 0;
  local_98._0_8_ = (pointer)0x0;
  local_98._8_8_ = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_98,0);
  std::locale::locale((locale *)&local_c8);
  local_40.m_Type = 0x2000;
  std::locale::locale(&local_40.m_Locale,(locale *)&local_c8);
  boost::algorithm::
  split<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_classifiedF>
            ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_98,&(this->super_Header).head_line_,&local_40,token_compress_on);
  std::locale::~locale(&local_40.m_Locale);
  std::locale::~locale((locale *)&local_c8);
  if (((long)local_78 - local_98._16_8_ >> 5) + ((long)local_68 - (long)pbStack_60 >> 5) +
      ((((ulong)((long)ppbStack_50 - (long)ppbStack_70) >> 3) - 1) +
      (ulong)(ppbStack_50 == (_Map_pointer)0x0)) * 0x10 < 2) {
    this_00 = (Malformed_packet *)__cxa_allocate_exception(0x18);
    local_c8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Bad response","");
    Malformed_packet::Malformed_packet(this_00,&local_c8);
    __cxa_throw(this_00,&Malformed_packet::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar6 = (long)(local_98._16_8_ - local_98._24_8_) >> 5;
  uVar1 = lVar6 + 1;
  if (lVar6 < -1) {
    uVar5 = (long)uVar1 >> 4;
  }
  else {
    if (uVar1 < 0x10) {
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_98._16_8_ + 0x20);
      goto LAB_00150e7e;
    }
    uVar5 = uVar1 >> 4;
  }
  pbVar4 = ppbStack_70[uVar5] + uVar1 + uVar5 * -0x10;
LAB_00150e7e:
  local_a4 = 0;
  local_c8._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  local_c8._M_string_length = (size_type)(local_c8._M_dataplus._M_p + pbVar4->_M_string_length);
  bVar3 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::shr_signed<int>
                    ((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)&local_c8,
                     &local_a4);
  if (bVar3) {
    *(int *)&(this->super_Header).field_0x8c = local_a4;
    if (2 < ((long)local_78 - local_98._16_8_ >> 5) + ((long)local_68 - (long)pbStack_60 >> 5) +
            ((((ulong)((long)ppbStack_50 - (long)ppbStack_70) >> 3) - 1) +
            (ulong)(ppbStack_50 == (_Map_pointer)0x0)) * 0x10) {
      std::__cxx11::string::_M_assign(local_a0);
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_98);
    return;
  }
  local_c8._M_dataplus._M_p = (pointer)&PTR__bad_cast_001891e8;
  local_c8._M_string_length = (size_type)&std::__cxx11::string::typeinfo;
  local_c8.field_2._M_allocated_capacity = (size_type)&int::typeinfo;
  boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_c8);
}

Assistant:

Response_header::Response_header(Verification_level lev, const std::string& to_parse):
  Header(lev)
{
  parse(to_parse);
  set_option_default(names::server, "unknown");

  typedef std::deque<std::string> Token;
  Token resp_line;
  boost::split(resp_line, get_head_line(), boost::is_space(), boost::token_compress_on);

  if (resp_line.size() < 2) {
    throw Malformed_packet("Bad response");
  }

  try {
    code_ = boost::lexical_cast<int>(resp_line[1]);
  } catch (const boost::bad_lexical_cast&) {
    code_ = 0;
  }

  if (resp_line.size() > 2)
    phrase_ = resp_line[2];
}